

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

int quicly_streambuf_create(quicly_stream_t *stream,size_t sz)

{
  ptls_buffer_t *buf;
  ulong in_RSI;
  long in_RDI;
  quicly_streambuf_t *sbuf;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RSI < 0x48) {
    __assert_fail("sz >= sizeof(*sbuf)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0xd7,"int quicly_streambuf_create(quicly_stream_t *, size_t)");
  }
  if (*(long *)(in_RDI + 0xb0) == 0) {
    buf = (ptls_buffer_t *)malloc(in_RSI);
    if (buf == (ptls_buffer_t *)0x0) {
      local_4 = 0x201;
    }
    else {
      quicly_sendbuf_init((quicly_sendbuf_t *)0x154f00);
      ptls_buffer_init(buf,in_stack_ffffffffffffffd8,0x154f19);
      if (in_RSI != 0x48) {
        memset(&buf[2].capacity,0,in_RSI - 0x48);
      }
      *(ptls_buffer_t **)(in_RDI + 0xb0) = buf;
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("stream->data == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                ,0xd8,"int quicly_streambuf_create(quicly_stream_t *, size_t)");
}

Assistant:

int quicly_streambuf_create(quicly_stream_t *stream, size_t sz)
{
    quicly_streambuf_t *sbuf;

    assert(sz >= sizeof(*sbuf));
    assert(stream->data == NULL);

    if ((sbuf = malloc(sz)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    quicly_sendbuf_init(&sbuf->egress);
    ptls_buffer_init(&sbuf->ingress, "", 0);
    if (sz != sizeof(*sbuf))
        memset((char *)sbuf + sizeof(*sbuf), 0, sz - sizeof(*sbuf));

    stream->data = sbuf;
    return 0;
}